

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLsSetup(CVodeMem cv_mem,int convfail,N_Vector ypred,N_Vector fpred,int *jcurPtr,
             N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  
  pvVar1 = cv_mem->cv_lmem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -2;
    cvProcessError(cv_mem,-2,0x608,"cvLsSetup",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                   ,"Linear solver memory is NULL.");
  }
  else {
    iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x48));
    if (iVar2 == 3) {
      *(undefined4 *)((long)pvVar1 + 0x138) = 0;
      iVar2 = 0;
    }
    else {
      *(N_Vector *)((long)pvVar1 + 0x70) = ypred;
      *(N_Vector *)((long)pvVar1 + 0x78) = fpred;
      bVar4 = true;
      if ((((cv_mem->cv_nst != 0) && (cv_mem->first_step_after_resize == 0)) &&
          (cv_mem->cv_nst < *(long *)((long)pvVar1 + 0x80) + *(long *)((long)pvVar1 + 0x98))) &&
         ((convfail != 1 ||
          (*(double *)((long)pvVar1 + 0x28) <= ABS(cv_mem->cv_gamma / cv_mem->cv_gammap + -1.0)))))
      {
        bVar4 = convfail == 2;
      }
      *(uint *)((long)pvVar1 + 0x20) = (uint)bVar4;
      if (*(long *)((long)pvVar1 + 0x50) == 0) {
        *jcurPtr = (uint)bVar4;
        uVar3 = 0;
      }
      else {
        iVar2 = (**(code **)((long)pvVar1 + 0x128))
                          (cv_mem->cv_tn,ypred,fpred,*(long *)((long)pvVar1 + 0x50),bVar4 ^ 1,
                           jcurPtr,*(undefined8 *)((long)pvVar1 + 0x130),vtemp1,vtemp2,vtemp3);
        if (*jcurPtr != 0) {
          *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + 1;
          *(long *)((long)pvVar1 + 0x98) = cv_mem->cv_nst;
          *(sunrealtype *)((long)pvVar1 + 0xd0) = cv_mem->cv_tn;
        }
        if (iVar2 != 0) {
          if (*(int *)((long)pvVar1 + 0x120) == 0) {
            return iVar2;
          }
          if (-1 < iVar2) {
            *(undefined4 *)((long)pvVar1 + 0x138) = 0xfffffff9;
            return 1;
          }
          cvProcessError(cv_mem,-6,0x638,"cvLsSetup",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                         ,"The Jacobian routine failed in an unrecoverable manner.");
          *(undefined4 *)((long)pvVar1 + 0x138) = 0xfffffffa;
          return -1;
        }
        uVar3 = *(undefined8 *)((long)pvVar1 + 0x50);
      }
      iVar2 = SUNLinSolSetup(*(undefined8 *)((long)pvVar1 + 0x48),uVar3);
      *(int *)((long)pvVar1 + 0x138) = iVar2;
      if (*(long *)((long)pvVar1 + 0x50) == 0) {
        if (*jcurPtr != 0) {
          *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 1;
          *(long *)((long)pvVar1 + 0x98) = cv_mem->cv_nst;
          *(sunrealtype *)((long)pvVar1 + 0xd0) = cv_mem->cv_tn;
        }
        if (*(int *)((long)pvVar1 + 0x20) != 0) {
          *jcurPtr = 1;
          iVar2 = *(int *)((long)pvVar1 + 0x138);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int cvLsSetup(CVodeMem cv_mem, int convfail, N_Vector ypred, N_Vector fpred,
              sunbooleantype* jcurPtr, N_Vector vtemp1, N_Vector vtemp2,
              N_Vector vtemp3)
{
  CVLsMem cvls_mem;
  sunrealtype dgamma;
  int retval;

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    cvls_mem->last_flag = CVLS_SUCCESS;
    return (cvls_mem->last_flag);
  }

  /* Set CVLs N_Vector pointers to current solution and rhs */
  cvls_mem->ycur = ypred;
  cvls_mem->fcur = fpred;

  /* Use nst, gamma/gammap, and convfail to set J/P eval. flag jok */
  dgamma         = SUNRabs((cv_mem->cv_gamma / cv_mem->cv_gammap) - ONE);
  cvls_mem->jbad = (cv_mem->cv_nst == 0) || (cv_mem->first_step_after_resize) ||
                   (cv_mem->cv_nst >= cvls_mem->nstlj + cvls_mem->msbj) ||
                   ((convfail == CV_FAIL_BAD_J) &&
                    (dgamma < cvls_mem->dgmax_jbad)) ||
                   (convfail == CV_FAIL_OTHER);

  /* Setup the linear system if necessary */
  if (cvls_mem->A != NULL)
  {
    /* Update J if appropriate and evaluate A = I - gamma J */
    retval = cvls_mem->linsys(cv_mem->cv_tn, ypred, fpred, cvls_mem->A,
                              !(cvls_mem->jbad), jcurPtr, cv_mem->cv_gamma,
                              cvls_mem->A_data, vtemp1, vtemp2, vtemp3);

    /* Update J eval count and step when J was last updated */
    if (*jcurPtr)
    {
      cvls_mem->nje++;
      cvls_mem->nstlj = cv_mem->cv_nst;
      cvls_mem->tnlj  = cv_mem->cv_tn;
    }

    /* Check linsys() return value and return if necessary */
    if (retval != CVLS_SUCCESS)
    {
      if (cvls_mem->user_linsys)
      {
        if (retval < 0)
        {
          cvProcessError(cv_mem, CVLS_JACFUNC_UNRECVR, __LINE__, __func__,
                         __FILE__, MSG_LS_JACFUNC_FAILED);
          cvls_mem->last_flag = CVLS_JACFUNC_UNRECVR;
          return (-1);
        }
        else
        {
          cvls_mem->last_flag = CVLS_JACFUNC_RECVR;
          return (1);
        }
      }
      else { return (retval); }
    }
  }
  else
  {
    /* Matrix-free case, set jcur to jbad */
    *jcurPtr = cvls_mem->jbad;
  }

  /* Call LS setup routine -- the LS may call cvLsPSetup, who will
     pass the heuristic suggestions above to the user code(s) */
  cvls_mem->last_flag = SUNLinSolSetup(cvls_mem->LS, cvls_mem->A);

  /* If Matrix-free, update heuristics flags */
  if (cvls_mem->A == NULL)
  {
    /* If user set jcur to SUNTRUE, increment npe and save nst value */
    if (*jcurPtr)
    {
      cvls_mem->npe++;
      cvls_mem->nstlj = cv_mem->cv_nst;
      cvls_mem->tnlj  = cv_mem->cv_tn;
    }

    /* Update jcur flag if we suggested an update */
    if (cvls_mem->jbad) { *jcurPtr = SUNTRUE; }
  }

  return (cvls_mem->last_flag);
}